

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O0

void * __thiscall
axl::io::MappedViewMgr::view
          (MappedViewMgr *this,uint64_t begin,uint64_t end,uint64_t origBegin,uint64_t origEnd)

{
  undefined4 uVar1;
  ViewEntry *pVVar2;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  it_00;
  RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *pRVar3;
  void *pvVar4;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  IVar5;
  uint64_t in_RDX;
  RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *in_RSI;
  MappedViewMgr *in_RDI;
  Iterator next;
  ViewEntry *oldViewEntry_1;
  ViewEntry *oldViewEntry;
  Iterator it;
  int protection;
  size_t size;
  void *p;
  MappedFile *mappedFile;
  ViewEntry *viewEntry;
  RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *p_00;
  Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int fd;
  ViewEntry *in_stack_ffffffffffffff20;
  BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
  *this_00;
  undefined4 in_stack_ffffffffffffff38;
  Entry *in_stack_ffffffffffffff50;
  unsigned_long in_stack_ffffffffffffff60;
  BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
  *in_stack_ffffffffffffff68;
  ViewEntry *pVVar6;
  Entry *local_88;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  local_78;
  IteratorImpl<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
  local_70;
  undefined4 local_64;
  Entry *local_60;
  void *local_58;
  MappedFile *local_50;
  ViewEntry *local_38;
  uint64_t local_20;
  RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *local_18;
  void *local_8;
  
  fd = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  pVVar2 = (ViewEntry *)operator_new(0x38);
  ViewEntry::ViewEntry(in_stack_ffffffffffffff20);
  local_38 = pVVar2;
  local_50 = getMappedFile(in_RDI);
  it_00.m_p = (Entry *)(local_20 - (long)local_18);
  uVar1 = 3;
  if ((local_50->m_fileFlags & 1) != 0) {
    uVar1 = 1;
  }
  this_00 = (BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
             *)&local_38->m_view;
  local_64 = uVar1;
  local_60 = it_00.m_p;
  sl::Handle::operator_cast_to_int((Handle *)local_50);
  p_00 = local_18;
  local_58 = psx::Mapping::map((Mapping *)CONCAT44(uVar1,in_stack_ffffffffffffff38),it_00.m_p,
                               (size_t)this_00,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                               (uint_t)in_stack_ffffffffffffff20,fd,
                               (size_t)in_stack_ffffffffffffff50);
  if (local_58 == (void *)0x0) {
    if (local_38 != (ViewEntry *)0x0) {
      pVVar2 = local_38;
      ViewEntry::~ViewEntry((ViewEntry *)0x16f277);
      operator_delete(pVVar2);
    }
    local_8 = (void *)0x0;
  }
  else {
    local_38->m_begin = (uint64_t)local_18;
    local_38->m_end = local_20;
    local_70.
    super_IteratorBase<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
    .m_p = (IteratorBase<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
            )sl::
             ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
             ::insertHead((ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
                           *)this_00,in_stack_ffffffffffffff20);
    local_78.m_p = (Entry *)sl::
                            BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
                            ::visit(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    pRVar3 = sl::
             IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
             ::operator->((IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                           *)&local_78);
    if ((pRVar3->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
        ).super_MapEntry<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>.m_value !=
        (ViewEntry *)0x0) {
      pRVar3 = sl::
               IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
               ::operator->((IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                             *)&local_78);
      pVVar2 = (pRVar3->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
               ).super_MapEntry<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>.m_value;
      sl::
      Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
      ::Iterator(in_stack_ffffffffffffff10,p_00);
      (pVVar2->m_mapIt).
      super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
      .
      super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
      .m_p = local_88;
    }
    (local_38->m_mapIt).
    super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
    .
    super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
    .m_p = local_78.m_p;
    pVVar2 = local_38;
    pRVar3 = sl::
             IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
             ::operator->((IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                           *)&local_78);
    (pRVar3->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
    ).super_MapEntry<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>.m_value = pVVar2;
    sl::
    IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
    ::operator++((IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                  *)p_00,0);
    while (pvVar4 = sl::IteratorBase::operator_cast_to_void_((IteratorBase *)&local_78),
          pvVar4 != (void *)0x0) {
      pRVar3 = sl::
               IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
               ::operator->((IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                             *)&local_78);
      pVVar6 = (pRVar3->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
               ).super_MapEntry<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>.m_value;
      if (local_20 < pVVar6->m_end) break;
      IVar5.m_p = (Entry *)sl::
                           IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                           ::getInc((IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                                     *)pVVar2,(intptr_t)in_stack_ffffffffffffff10);
      sl::
      BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
      ::erase(this_00,(Iterator)it_00.m_p);
      sl::
      Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
      ::Iterator(in_stack_ffffffffffffff10,p_00);
      (pVVar6->m_mapIt).
      super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
      .
      super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
      .m_p = in_stack_ffffffffffffff50;
      local_78.m_p = IVar5.m_p;
    }
    local_8 = local_58;
  }
  return local_8;
}

Assistant:

void*
MappedViewMgr::view(
	uint64_t begin,
	uint64_t end,
	uint64_t origBegin,
	uint64_t origEnd
) {
	ViewEntry* viewEntry = new ViewEntry;

	MappedFile* mappedFile = getMappedFile();
	void* p;
	size_t size = (size_t)(end - begin);

#if (_AXL_OS_WIN)
	uint_t access = (mappedFile->m_fileFlags & FileFlag_ReadOnly) ?
		FILE_MAP_READ :
		FILE_MAP_READ | FILE_MAP_WRITE;

	p = viewEntry->m_view.view(mappedFile->m_mapping, access, begin, size);
#elif (_AXL_OS_POSIX)
	int protection = (mappedFile->m_fileFlags & FileFlag_ReadOnly) ?
		PROT_READ :
		PROT_READ | PROT_WRITE;

	p = viewEntry->m_view.map(
			NULL,
			size,
			protection,
			MAP_SHARED,
			mappedFile->m_file.m_file,
			begin
		);
#endif

	if (!p) {
		delete viewEntry;
		return NULL;
	}

	viewEntry->m_begin = begin;
	viewEntry->m_end = end;

	m_viewList.insertHead(viewEntry);

	// update viewmap

	ViewMap::Iterator it = m_viewMap.visit(begin);
	if (it->m_value) {
		ViewEntry* oldViewEntry = it->m_value;

		ASSERT(oldViewEntry->m_mapIt == it);
		ASSERT(oldViewEntry->m_end < end); // otherwise, we should have just used this view!

		oldViewEntry->m_mapIt = NULL; // this view is removed from the map
	}

	viewEntry->m_mapIt = it;
	it->m_value = viewEntry;

	// now, for all the old views that are completely overlapped by this new view --
	// remove them from the map (but do not unmap yet, so recent View () results still valid)

	it++;
	while (it) {
		ViewEntry* oldViewEntry = it->m_value;
		if (oldViewEntry->m_end > end) // nope, not overlapped
			break;

		ASSERT(oldViewEntry->m_mapIt == it);

		// this view is completely overlapped and is not needed for new view requests
		// remove it from map but do not delete it to make sure last N view request are still valid

		ViewMap::Iterator next = it.getInc(1);
		m_viewMap.erase(it);
		oldViewEntry->m_mapIt = NULL;

		it = next;
	}

	return p;
}